

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>::
fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
             *this,int i)

{
  value_type *pvVar1;
  long in_RDI;
  Fad<long_double> *in_stack_ffffffffffffffd0;
  
  FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)
             in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  Fad<long_double>::val(*(Fad<long_double> **)(in_RDI + 8));
  Fad<long_double>::fastAccessDx(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  pvVar1 = FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>::val
                     ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)0x13622e2);
  return pvVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}